

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,ON_SimpleArray<ON_DisplayMaterialRef> *a)

{
  int iVar1;
  ON_DisplayMaterialRef *pOVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ON__INT32 local_34;
  
  iVar1 = a->m_count;
  uVar5 = 1;
  bVar3 = WriteInt32(this,1,&local_34);
  if (bVar3 && 0 < (long)iVar1) {
    lVar4 = 0x10;
    do {
      pOVar2 = a->m_a;
      bVar3 = WriteUuid(this,(ON_UUID *)((long)(&pOVar2->m_viewport_id + -1) + lVar4));
      if (bVar3) {
        bVar3 = WriteUuid(this,(ON_UUID *)((pOVar2->m_viewport_id).Data4 + lVar4 + -8));
      }
      if ((ulong)(long)iVar1 <= uVar5) {
        return bVar3;
      }
      lVar4 = lVar4 + 0x20;
      uVar5 = uVar5 + 1;
    } while (bVar3 != false);
  }
  return bVar3;
}

Assistant:

bool
ON_BinaryArchive::WriteArray( const ON_SimpleArray<ON_DisplayMaterialRef>& a )
{
  int i, count = a.Count();
  if ( count < 0 )
    count = 0;
  bool rc = WriteInt( count );
  for  ( i = 0; i < count && rc; i++ )
  {
    rc = WriteDisplayMaterialRef( a[i] );
  }
  return rc;
}